

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_between.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundBetweenExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  DataChunk *this_00;
  LogicalType *type;
  reference pvVar1;
  type pEVar2;
  reference pvVar3;
  idx_t iVar4;
  InvalidTypeException *pIVar5;
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  *this_01;
  allocator local_189;
  Vector input;
  Vector upper;
  Vector lower;
  string local_50;
  
  this_00 = &state->intermediate_chunk;
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
  Vector::Vector(&input,pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,1);
  Vector::Vector(&lower,pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,2);
  Vector::Vector(&upper,pvVar1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->input);
  this_01 = &state->child_states;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::get<true>(this_01,0);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&input);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->lower);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::get<true>(this_01,1);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&lower);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->upper);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::get<true>(this_01,2);
  Execute(this,pEVar2,
          (pvVar3->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&upper);
  type = &input.type;
  if (expr->upper_inclusive == true) {
    if (expr->lower_inclusive == false) {
      switch(input.type.physical_type_) {
      case BOOL:
      case INT8:
        iVar4 = TernaryExecutor::
                Select<signed_char,signed_char,signed_char,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT8:
        iVar4 = TernaryExecutor::
                Select<unsigned_char,unsigned_char,unsigned_char,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT16:
        iVar4 = TernaryExecutor::
                Select<unsigned_short,unsigned_short,unsigned_short,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT16:
        iVar4 = TernaryExecutor::Select<short,short,short,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT32:
        iVar4 = TernaryExecutor::
                Select<unsigned_int,unsigned_int,unsigned_int,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT32:
        iVar4 = TernaryExecutor::Select<int,int,int,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT64:
        iVar4 = TernaryExecutor::
                Select<unsigned_long,unsigned_long,unsigned_long,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT64:
        iVar4 = TernaryExecutor::Select<long,long,long,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT64|UINT8:
      case DOUBLE|BOOL:
      case DOUBLE|UINT8:
      case DOUBLE|INT8:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
switchD_013850cd_caseD_a:
        pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_50,"Invalid type for BETWEEN",&local_189);
        InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
        __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar4 = TernaryExecutor::Select<float,float,float,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case DOUBLE:
        iVar4 = TernaryExecutor::Select<double,double,double,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INTERVAL:
        iVar4 = TernaryExecutor::
                Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      default:
        if (input.type.physical_type_ == VARCHAR) {
          iVar4 = TernaryExecutor::
                  Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::UpperInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
        else if (input.type.physical_type_ == UINT128) {
          iVar4 = TernaryExecutor::
                  Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UpperInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
        else {
          if (input.type.physical_type_ != INT128) goto switchD_013850cd_caseD_a;
          iVar4 = TernaryExecutor::
                  Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UpperInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
      }
    }
    else {
      switch(input.type.physical_type_) {
      case BOOL:
      case INT8:
        iVar4 = TernaryExecutor::
                Select<signed_char,signed_char,signed_char,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT8:
        iVar4 = TernaryExecutor::
                Select<unsigned_char,unsigned_char,unsigned_char,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT16:
        iVar4 = TernaryExecutor::
                Select<unsigned_short,unsigned_short,unsigned_short,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT16:
        iVar4 = TernaryExecutor::Select<short,short,short,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT32:
        iVar4 = TernaryExecutor::
                Select<unsigned_int,unsigned_int,unsigned_int,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT32:
        iVar4 = TernaryExecutor::Select<int,int,int,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT64:
        iVar4 = TernaryExecutor::
                Select<unsigned_long,unsigned_long,unsigned_long,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INT64:
        iVar4 = TernaryExecutor::Select<long,long,long,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case UINT64|UINT8:
      case DOUBLE|BOOL:
      case DOUBLE|UINT8:
      case DOUBLE|INT8:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
switchD_01385031_caseD_a:
        pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_50,"Invalid type for BETWEEN",&local_189);
        InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
        __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar4 = TernaryExecutor::Select<float,float,float,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case DOUBLE:
        iVar4 = TernaryExecutor::Select<double,double,double,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      case INTERVAL:
        iVar4 = TernaryExecutor::
                Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BothInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
        break;
      default:
        if (input.type.physical_type_ == VARCHAR) {
          iVar4 = TernaryExecutor::
                  Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BothInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
        else if (input.type.physical_type_ == UINT128) {
          iVar4 = TernaryExecutor::
                  Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BothInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
        else {
          if (input.type.physical_type_ != INT128) goto switchD_01385031_caseD_a;
          iVar4 = TernaryExecutor::
                  Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BothInclusiveBetweenOperator>
                            (&input,&lower,&upper,sel,count,true_sel,false_sel);
        }
      }
    }
  }
  else if (expr->lower_inclusive == false) {
    switch(input.type.physical_type_) {
    case BOOL:
    case INT8:
      iVar4 = TernaryExecutor::
              Select<signed_char,signed_char,signed_char,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT8:
      iVar4 = TernaryExecutor::
              Select<unsigned_char,unsigned_char,unsigned_char,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT16:
      iVar4 = TernaryExecutor::
              Select<unsigned_short,unsigned_short,unsigned_short,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT16:
      iVar4 = TernaryExecutor::Select<short,short,short,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT32:
      iVar4 = TernaryExecutor::
              Select<unsigned_int,unsigned_int,unsigned_int,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT32:
      iVar4 = TernaryExecutor::Select<int,int,int,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT64:
      iVar4 = TernaryExecutor::
              Select<unsigned_long,unsigned_long,unsigned_long,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT64:
      iVar4 = TernaryExecutor::Select<long,long,long,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
switchD_01385117_caseD_a:
      pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_50,"Invalid type for BETWEEN",&local_189);
      InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
      __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      iVar4 = TernaryExecutor::Select<float,float,float,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case DOUBLE:
      iVar4 = TernaryExecutor::Select<double,double,double,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INTERVAL:
      iVar4 = TernaryExecutor::
              Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::ExclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    default:
      if (input.type.physical_type_ == VARCHAR) {
        iVar4 = TernaryExecutor::
                Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::ExclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
      else if (input.type.physical_type_ == UINT128) {
        iVar4 = TernaryExecutor::
                Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::ExclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
      else {
        if (input.type.physical_type_ != INT128) goto switchD_01385117_caseD_a;
        iVar4 = TernaryExecutor::
                Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ExclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
    }
  }
  else {
    switch(input.type.physical_type_) {
    case BOOL:
    case INT8:
      iVar4 = TernaryExecutor::
              Select<signed_char,signed_char,signed_char,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT8:
      iVar4 = TernaryExecutor::
              Select<unsigned_char,unsigned_char,unsigned_char,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT16:
      iVar4 = TernaryExecutor::
              Select<unsigned_short,unsigned_short,unsigned_short,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT16:
      iVar4 = TernaryExecutor::Select<short,short,short,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT32:
      iVar4 = TernaryExecutor::
              Select<unsigned_int,unsigned_int,unsigned_int,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT32:
      iVar4 = TernaryExecutor::Select<int,int,int,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT64:
      iVar4 = TernaryExecutor::
              Select<unsigned_long,unsigned_long,unsigned_long,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INT64:
      iVar4 = TernaryExecutor::Select<long,long,long,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
switchD_01385083_caseD_a:
      pIVar5 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_50,"Invalid type for BETWEEN",&local_189);
      InvalidTypeException::InvalidTypeException(pIVar5,type,&local_50);
      __cxa_throw(pIVar5,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      iVar4 = TernaryExecutor::Select<float,float,float,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case DOUBLE:
      iVar4 = TernaryExecutor::Select<double,double,double,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    case INTERVAL:
      iVar4 = TernaryExecutor::
              Select<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator>
                        (&input,&lower,&upper,sel,count,true_sel,false_sel);
      break;
    default:
      if (input.type.physical_type_ == VARCHAR) {
        iVar4 = TernaryExecutor::
                Select<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::LowerInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
      else if (input.type.physical_type_ == UINT128) {
        iVar4 = TernaryExecutor::
                Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::LowerInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
      else {
        if (input.type.physical_type_ != INT128) goto switchD_01385083_caseD_a;
        iVar4 = TernaryExecutor::
                Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::LowerInclusiveBetweenOperator>
                          (&input,&lower,&upper,sel,count,true_sel,false_sel);
      }
    }
  }
  Vector::~Vector(&upper);
  Vector::~Vector(&lower);
  Vector::~Vector(&input);
  return iVar4;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundBetweenExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifdef DUCKDB_SMALLER_BINARY
	throw InternalException("ExpressionExecutor::Select not available with DUCKDB_SMALLER_BINARY");
#else
	// resolve the children
	Vector input(state->intermediate_chunk.data[0]);
	Vector lower(state->intermediate_chunk.data[1]);
	Vector upper(state->intermediate_chunk.data[2]);

	Execute(*expr.input, state->child_states[0].get(), sel, count, input);
	Execute(*expr.lower, state->child_states[1].get(), sel, count, lower);
	Execute(*expr.upper, state->child_states[2].get(), sel, count, upper);

	if (expr.upper_inclusive && expr.lower_inclusive) {
		return BetweenLoopTypeSwitch<BothInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                           false_sel);
	} else if (expr.lower_inclusive) {
		return BetweenLoopTypeSwitch<LowerInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                            false_sel);
	} else if (expr.upper_inclusive) {
		return BetweenLoopTypeSwitch<UpperInclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel,
		                                                            false_sel);
	} else {
		return BetweenLoopTypeSwitch<ExclusiveBetweenOperator>(input, lower, upper, sel, count, true_sel, false_sel);
	}
#endif
}